

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

void __thiscall
capnp::_::PointerBuilder::copyFrom(PointerBuilder *this,PointerReader other,bool canonical)

{
  word *pwVar1;
  WirePointer *pWVar2;
  WirePointer *srcTarget;
  long lVar3;
  
  if (other.pointer == (WirePointer *)0x0) {
    pWVar2 = this->pointer;
    if ((pWVar2->field_1).upper32Bits != 0 || (pWVar2->offsetAndKind).value != 0) {
      WireHelpers::zeroObject(this->segment,this->capTable,pWVar2);
      pWVar2 = this->pointer;
      pWVar2->offsetAndKind = 0;
      pWVar2->field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
    }
  }
  else {
    pWVar2 = other.pointer + 1;
    lVar3 = (long)((int)((other.pointer)->offsetAndKind).value >> 2);
    if (other.segment == (SegmentReader *)0x0) {
      srcTarget = pWVar2 + lVar3;
    }
    else {
      pwVar1 = ((other.segment)->ptr).ptr;
      srcTarget = (WirePointer *)(pwVar1 + ((other.segment)->ptr).size_);
      if (((long)pwVar1 - (long)pWVar2 >> 3 <= lVar3) &&
         (lVar3 <= (long)srcTarget - (long)pWVar2 >> 3)) {
        srcTarget = pWVar2 + lVar3;
      }
    }
    WireHelpers::copyPointer
              (this->segment,this->capTable,this->pointer,other.segment,other.capTable,other.pointer
               ,(word *)srcTarget,other.nestingLimit,(BuilderArena *)0x0,canonical);
  }
  return;
}

Assistant:

void PointerBuilder::copyFrom(PointerReader other, bool canonical) {
  if (other.pointer == nullptr) {
    if (!pointer->isNull()) {
      WireHelpers::zeroObject(segment, capTable, pointer);
      WireHelpers::zeroMemory(pointer);
    }
  } else {
    WireHelpers::copyPointer(segment, capTable, pointer,
                             other.segment, other.capTable, other.pointer, other.nestingLimit,
                             nullptr,
                             canonical);
  }
}